

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O2

void __thiscall sf::RenderTarget::popGLStates(RenderTarget *this)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = anon_unknown.dwarf_42c354::RenderTargetImpl::isActive(this->m_id);
  if (!bVar1) {
    iVar2 = (*this->_vptr_RenderTarget[4])(this,1);
    if ((char)iVar2 == '\0') {
      return;
    }
  }
  (*sf_glad_glMatrixMode)(0x1701);
  (*sf_glad_glPopMatrix)();
  (*sf_glad_glMatrixMode)(0x1700);
  (*sf_glad_glPopMatrix)();
  (*sf_glad_glMatrixMode)(0x1702);
  (*sf_glad_glPopMatrix)();
  (*sf_glad_glPopClientAttrib)();
  (*sf_glad_glPopAttrib)();
  return;
}

Assistant:

void RenderTarget::popGLStates()
{
    if (RenderTargetImpl::isActive(m_id) || setActive(true))
    {
        glCheck(glMatrixMode(GL_PROJECTION));
        glCheck(glPopMatrix());
        glCheck(glMatrixMode(GL_MODELVIEW));
        glCheck(glPopMatrix());
        glCheck(glMatrixMode(GL_TEXTURE));
        glCheck(glPopMatrix());
        #ifndef SFML_OPENGL_ES
            glCheck(glPopClientAttrib());
            glCheck(glPopAttrib());
        #endif
    }
}